

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_function_simd.cpp
# Opt level: O0

void sse::Invert(uint32_t rowSizeIn,uint32_t rowSizeOut,uint8_t *inY,uint8_t *outY,uint8_t *outYEnd,
                uint32_t simdWidth,uint32_t totalSimdWidth,uint32_t nonSimdWidth)

{
  undefined1 auVar1 [16];
  byte *pbVar2;
  undefined1 auVar3 [16];
  byte *local_d0;
  byte *local_c8;
  uint8_t *local_b8;
  undefined1 (*local_b0) [16];
  uint8_t *local_88;
  uint8_t *outXEnd;
  uint8_t *outX;
  uint8_t *inX;
  simd *src1End;
  simd *dst;
  simd *src1;
  simd mask;
  char maskValue;
  uint32_t simdWidth_local;
  uint8_t *outYEnd_local;
  uint8_t *outY_local;
  uint8_t *inY_local;
  uint32_t rowSizeOut_local;
  uint32_t rowSizeIn_local;
  
  auVar1 = vpinsrb_avx(ZEXT116(0xff),0xff,1);
  auVar1 = vpinsrb_avx(auVar1,0xff,2);
  auVar1 = vpinsrb_avx(auVar1,0xff,3);
  auVar1 = vpinsrb_avx(auVar1,0xff,4);
  auVar1 = vpinsrb_avx(auVar1,0xff,5);
  auVar1 = vpinsrb_avx(auVar1,0xff,6);
  auVar1 = vpinsrb_avx(auVar1,0xff,7);
  auVar1 = vpinsrb_avx(auVar1,0xff,8);
  auVar1 = vpinsrb_avx(auVar1,0xff,9);
  auVar1 = vpinsrb_avx(auVar1,0xff,10);
  auVar1 = vpinsrb_avx(auVar1,0xff,0xb);
  auVar1 = vpinsrb_avx(auVar1,0xff,0xc);
  auVar1 = vpinsrb_avx(auVar1,0xff,0xd);
  auVar1 = vpinsrb_avx(auVar1,0xff,0xe);
  auVar1 = vpinsrb_avx(auVar1,0xff,0xf);
  outXEnd = inY;
  for (local_88 = outY; local_88 != outYEnd; local_88 = local_88 + rowSizeOut) {
    local_b8 = local_88;
    for (local_b0 = (undefined1 (*) [16])outXEnd;
        local_b0 != (undefined1 (*) [16])(outXEnd + (ulong)simdWidth * 0x10);
        local_b0 = local_b0 + 1) {
      auVar3 = *local_b0;
      auVar3 = vpternlogq_avx512vl(auVar3,auVar3,auVar3,0xf);
      auVar3 = vpand_avx(auVar3,auVar1);
      src1End = auVar3._0_8_;
      dst = auVar3._8_8_;
      *(simd **)local_b8 = src1End;
      *(simd **)(local_b8 + 8) = dst;
      local_b8 = local_b8 + 0x10;
    }
    if (nonSimdWidth != 0) {
      local_c8 = outXEnd + totalSimdWidth;
      local_d0 = local_88 + totalSimdWidth;
      pbVar2 = local_d0 + nonSimdWidth;
      for (; local_d0 != pbVar2; local_d0 = local_d0 + 1) {
        *local_d0 = *local_c8 ^ 0xff;
        local_c8 = local_c8 + 1;
      }
    }
    outXEnd = outXEnd + rowSizeIn;
  }
  return;
}

Assistant:

void Invert( uint32_t rowSizeIn, uint32_t rowSizeOut, const uint8_t * inY, uint8_t * outY, const uint8_t * outYEnd,
                 uint32_t simdWidth, uint32_t totalSimdWidth, uint32_t nonSimdWidth )
    {
        const char maskValue = static_cast<char>(0xffu);
        const simd mask = _mm_set_epi8( maskValue, maskValue, maskValue, maskValue, maskValue, maskValue, maskValue, maskValue,
                                        maskValue, maskValue, maskValue, maskValue, maskValue, maskValue, maskValue, maskValue );

        for( ; outY != outYEnd; outY += rowSizeOut, inY += rowSizeIn ) {
            const simd * src1 = reinterpret_cast <const simd*> (inY);
            simd       * dst  = reinterpret_cast <simd*> (outY);

            const simd * src1End = src1 + simdWidth;

            for( ; src1 != src1End; ++src1, ++dst )
                _mm_storeu_si128( dst, _mm_andnot_si128( _mm_loadu_si128( src1 ), mask ) );

            if( nonSimdWidth > 0 ) {
                const uint8_t * inX  = inY  + totalSimdWidth;
                uint8_t       * outX = outY + totalSimdWidth;

                const uint8_t * outXEnd = outX + nonSimdWidth;

                for( ; outX != outXEnd; ++outX, ++inX )
                    (*outX) = ~(*inX);
            }
        }
    }